

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O0

void __thiscall
xmrig::HttpsClient::HttpsClient
          (HttpsClient *this,int method,String *url,IHttpListener *listener,char *data,size_t size,
          String *fingerprint)

{
  SSL_METHOD *meth;
  SSL_CTX *pSVar1;
  BIO_METHOD *pBVar2;
  BIO *pBVar3;
  size_t in_RDX;
  undefined4 in_ESI;
  IHttpListener *in_RDI;
  String *unaff_retaddr;
  int in_stack_0000000c;
  HttpClient *in_stack_00000010;
  String *in_stack_ffffffffffffff78;
  String *in_stack_ffffffffffffff80;
  undefined4 in_stack_fffffffffffffff0;
  
  HttpClient::HttpClient
            (in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_RDI,
             (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  in_RDI->_vptr_IHttpListener = (_func_int **)&PTR__HttpsClient_002b8cf0;
  in_RDI[0x1d]._vptr_IHttpListener = (_func_int **)&DAT_002b8d30;
  *(undefined1 *)&in_RDI[0x23]._vptr_IHttpListener = 0;
  memset((void *)((long)&in_RDI[0x23]._vptr_IHttpListener + 1),0,0x800);
  in_RDI[0x12d]._vptr_IHttpListener = (_func_int **)0x0;
  String::String(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  meth = (SSL_METHOD *)TLS_method();
  pSVar1 = SSL_CTX_new(meth);
  in_RDI[0x12e]._vptr_IHttpListener = (_func_int **)pSVar1;
  if (in_RDI[0x12e]._vptr_IHttpListener != (_func_int **)0x0) {
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    in_RDI[0x22]._vptr_IHttpListener = (_func_int **)pBVar3;
    pBVar2 = BIO_s_mem();
    pBVar3 = BIO_new(pBVar2);
    in_RDI[0x21]._vptr_IHttpListener = (_func_int **)pBVar3;
    SSL_CTX_set_options(in_RDI[0x12e]._vptr_IHttpListener,0x2000000);
  }
  return;
}

Assistant:

xmrig::HttpsClient::HttpsClient(int method, const String &url, IHttpListener *listener, const char *data, size_t size, const String &fingerprint) :
    HttpClient(method, url, listener, data, size),
    m_ready(false),
    m_buf(),
    m_ssl(nullptr),
    m_fp(fingerprint)
{
    m_ctx = SSL_CTX_new(SSLv23_method());
    assert(m_ctx != nullptr);

    if (!m_ctx) {
        return;
    }

    m_writeBio = BIO_new(BIO_s_mem());
    m_readBio  = BIO_new(BIO_s_mem());
    SSL_CTX_set_options(m_ctx, SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
}